

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O2

bool hasConnectedNodes(Network *nw)

{
  pointer ppLVar1;
  Link *pLVar2;
  bool bVar3;
  uint uVar4;
  pointer ppLVar5;
  NetworkError *this;
  Node *pNVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  string local_90;
  undefined1 local_70 [8];
  vector<char,_std::allocator<char>_> marked;
  value_type local_3a;
  allocator_type local_39 [9];
  
  uVar4 = Network::count(nw,NODE);
  local_3a = '\0';
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_70,(long)(int)uVar4,&local_3a,local_39);
  ppLVar1 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar5 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar5 != ppLVar1; ppLVar5 = ppLVar5 + 1) {
    pLVar2 = *ppLVar5;
    *(char *)((long)local_70 + (long)(pLVar2->fromNode->super_Element).index) =
         *(char *)((long)local_70 + (long)(pLVar2->fromNode->super_Element).index) + '\x01';
    *(char *)((long)local_70 + (long)(pLVar2->toNode->super_Element).index) =
         *(char *)((long)local_70 + (long)(pLVar2->toNode->super_Element).index) + '\x01';
  }
  marked.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&nw->msgLog;
  uVar8 = 0;
  uVar9 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar9 = uVar8;
  }
  iVar10 = 0;
  while( true ) {
    if (uVar9 == uVar8) {
      if (10 < iVar10) {
        poVar7 = std::operator<<((ostream *)
                                 marked.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,
                                 "\n\n NETWORK ERROR 233: no links connected to another ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar10 + -10);
        std::operator<<(poVar7," nodes ");
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_70);
      return iVar10 == 0;
    }
    if ((*(char *)((long)local_70 + uVar8) == '\0') &&
       (bVar3 = iVar10 < 10, iVar10 = iVar10 + 1, bVar3)) break;
    uVar8 = uVar8 + 1;
  }
  this = (NetworkError *)__cxa_allocate_exception(0x30);
  pNVar6 = Network::node(nw,(int)uVar8);
  std::__cxx11::string::string((string *)&local_90,(string *)&(pNVar6->super_Element).name);
  NetworkError::NetworkError(this,8,&local_90);
  __cxa_throw(this,&NetworkError::typeinfo,ENerror::~ENerror);
}

Assistant:

bool hasConnectedNodes(Network* nw)
{
    int nodeCount = nw->count(Element::NODE);
    vector<char> marked(nodeCount, 0);
    for (Link* link : nw->links)
    {
        marked[link->fromNode->index]++;
        marked[link->toNode->index]++;
    }

    int unmarkedCount = 0;
    for (int i = 0; i < nodeCount; i++)
    {
        try
        {
            if ( !marked[i] )
            {
                unmarkedCount++;
                if ( unmarkedCount <= 10 )
                    throw NetworkError(
                        NetworkError::UNCONNECTED_NODE, nw->node(i)->name);
            }
        }
        catch (ENerror const& e)
        {
            nw->msgLog << e.msg;
        }
    }
    if ( unmarkedCount > 10 )
    {
        nw->msgLog << "\n\n NETWORK ERROR 233: no links connected to another "
                   << (unmarkedCount - 10) << " nodes ";
    }
    return (unmarkedCount == 0);
}